

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void __thiscall zsummer::log4z::CLock::CLock(CLock *this)

{
  pthread_mutexattr_t attr;
  
  this->_vptr_CLock = (_func_int **)&PTR__CLock_0014ad08;
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
  pthread_mutex_init((pthread_mutex_t *)&this->m_crit,(pthread_mutexattr_t *)&attr);
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  return;
}

Assistant:

CLock()
	{
#ifdef WIN32
		InitializeCriticalSection(&m_crit);
#else
		//m_crit = PTHREAD_RECURSIVE_MUTEX_INITIALIZER_NP;
		pthread_mutexattr_t attr;
		pthread_mutexattr_init(&attr);
		pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
		pthread_mutex_init(&m_crit, &attr);
		pthread_mutexattr_destroy(&attr);
#endif
	}